

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  U32 UVar2;
  seqDef *psVar3;
  bool bVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  BYTE *pBVar11;
  uint uVar12;
  uint uVar13;
  BYTE *pBVar14;
  int *piVar15;
  U32 UVar16;
  char *pcVar17;
  int *piVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int *piVar22;
  uint uVar23;
  BYTE *pBVar24;
  int iVar25;
  int *ip;
  ulong uVar26;
  ulong uVar27;
  size_t ofbCandidate;
  U32 maxDistance;
  uint local_ec;
  int *local_e8;
  int *local_e0;
  size_t local_d8;
  ZSTD_matchState_t *local_d0;
  ulong local_c8;
  int *local_c0;
  seqStore_t *local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  int local_a0;
  uint local_9c;
  BYTE *local_98;
  int *local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  uint *local_70;
  BYTE *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  piVar22 = (int *)((long)src + srcSize);
  piVar18 = (int *)((long)src + (srcSize - 8));
  pBVar14 = (ms->window).base;
  pBVar11 = (ms->window).dictBase;
  uVar12 = (ms->window).dictLimit;
  uVar10 = (ulong)uVar12;
  local_98 = pBVar14 + uVar10;
  uVar7 = (ms->window).lowLimit;
  uVar13 = (ms->cParams).windowLog;
  uVar20 = (ms->cParams).minMatch;
  uVar23 = 6;
  if (uVar20 < 6) {
    uVar23 = uVar20;
  }
  local_9c = 4;
  if (4 < uVar23) {
    local_9c = uVar23;
  }
  uVar20 = *rep;
  local_ec = rep[1];
  ms->lazySkipping = 0;
  ip = (int *)((ulong)(local_98 == (BYTE *)src) + (long)src);
  local_e8 = (int *)src;
  local_70 = rep;
  if (ip < piVar18) {
    local_90 = (int *)(pBVar11 + uVar10);
    local_68 = pBVar11 + uVar7;
    uVar7 = 1 << ((byte)uVar13 & 0x1f);
    local_88 = (ulong)uVar7;
    local_a0 = uVar12 - 1;
    local_80 = piVar22 + -8;
    iVar8 = (int)pBVar14;
    local_58 = (ulong)(1 - (uVar7 + iVar8));
    local_50 = (ulong)(1 - iVar8);
    local_60 = (ulong)((uVar12 + iVar8) - 2);
    local_d0 = ms;
    local_c8 = uVar10;
    local_c0 = piVar22;
    local_b8 = seqStore;
    local_b0 = pBVar11;
    local_a8 = pBVar14;
    local_78 = piVar18;
    do {
      iVar25 = (int)ip;
      iVar8 = (iVar25 - (int)pBVar14) + 1;
      UVar2 = (ms->window).lowLimit;
      UVar16 = iVar8 - (uint)local_88;
      if (iVar8 - UVar2 <= (uint)local_88) {
        UVar16 = UVar2;
      }
      if (ms->loadedDictEnd != 0) {
        UVar16 = UVar2;
      }
      uVar12 = iVar8 - uVar20;
      if (uVar12 < (uint)uVar10) {
        pBVar14 = pBVar11;
      }
      if (local_a0 - uVar12 < 3) {
LAB_001ea44e:
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if (uVar20 <= iVar8 - UVar16) {
          if (*(int *)((long)ip + 1) != *(int *)(pBVar14 + uVar12)) goto LAB_001ea44e;
          piVar15 = piVar22;
          if (uVar12 < (uint)uVar10) {
            piVar15 = local_90;
          }
          sVar9 = ZSTD_count_2segments
                            ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar14 + uVar12) + 4),
                             (BYTE *)piVar22,(BYTE *)piVar15,local_98);
          uVar21 = sVar9 + 4;
          ms = local_d0;
        }
      }
      local_d8 = 999999999;
      if (local_9c == 6) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip,(BYTE *)piVar22,&local_d8);
      }
      else if (local_9c == 5) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)ip,(BYTE *)piVar22,&local_d8);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)ip,(BYTE *)piVar22,&local_d8);
      }
      uVar26 = uVar21;
      if (uVar21 < uVar10) {
        uVar26 = uVar10;
      }
      if (uVar26 < 4) {
        uVar10 = (long)ip - (long)local_e8;
        ip = (int *)((long)ip + (uVar10 >> 8) + 1);
        local_d0->lazySkipping = (uint)(0x8ff < uVar10);
        ms = local_d0;
        pBVar14 = local_a8;
        pBVar11 = local_b0;
        uVar10 = local_c8;
      }
      else {
        local_e0 = ip;
        uVar27 = local_d8;
        if (uVar10 <= uVar21) {
          local_e0 = (int *)((long)ip + 1);
          uVar27 = 1;
        }
        local_38 = (ulong)(uint)((int)local_58 + iVar25);
        uVar12 = (int)local_50 + iVar25;
        local_40 = (ulong)uVar12;
        uVar7 = ((int)local_60 + uVar20) - iVar25;
        local_48 = (ulong)(uVar12 - uVar20);
        lVar19 = 0;
        do {
          if (local_78 <= (int *)(lVar19 + (long)ip)) break;
          piVar22 = (int *)((long)ip + lVar19 + 1);
          uVar12 = (uint)uVar27;
          if (uVar27 == 0) {
            uVar27 = 0;
          }
          else {
            UVar2 = (local_d0->window).lowLimit;
            iVar25 = (int)lVar19;
            iVar8 = (int)local_40 + iVar25;
            UVar16 = (int)local_38 + iVar25;
            if (iVar8 - UVar2 <= (uint)local_88) {
              UVar16 = UVar2;
            }
            if (local_d0->loadedDictEnd != 0) {
              UVar16 = UVar2;
            }
            uVar13 = (int)local_48 + iVar25;
            pBVar14 = local_a8;
            if (uVar13 < (uint)local_c8) {
              pBVar14 = local_b0;
            }
            if (((2 < uVar7) && (uVar20 <= iVar8 - UVar16)) &&
               (*piVar22 == *(int *)(pBVar14 + uVar13))) {
              piVar18 = local_c0;
              if (uVar13 < (uint)local_c8) {
                piVar18 = local_90;
              }
              sVar9 = ZSTD_count_2segments
                                ((BYTE *)((long)ip + lVar19 + 5),
                                 (BYTE *)((long)(pBVar14 + uVar13) + 4),(BYTE *)local_c0,
                                 (BYTE *)piVar18,local_98);
              if (uVar12 == 0) goto LAB_001eaafa;
              if (sVar9 < 0xfffffffffffffffc) {
                uVar13 = 0x1f;
                if (uVar12 != 0) {
                  for (; uVar12 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                  }
                }
                if ((int)((uVar13 ^ 0x1f) + (int)uVar26 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                  uVar27 = 1;
                  uVar26 = sVar9 + 4;
                  local_e0 = piVar22;
                }
              }
            }
          }
          local_d8 = 999999999;
          if (local_9c == 6) {
            uVar10 = ZSTD_HcFindBestMatch_extDict_6
                               (local_d0,(BYTE *)piVar22,(BYTE *)local_c0,&local_d8);
          }
          else if (local_9c == 5) {
            uVar10 = ZSTD_HcFindBestMatch_extDict_5
                               (local_d0,(BYTE *)piVar22,(BYTE *)local_c0,&local_d8);
          }
          else {
            uVar10 = ZSTD_HcFindBestMatch_extDict_4
                               (local_d0,(BYTE *)piVar22,(BYTE *)local_c0,&local_d8);
          }
          uVar12 = (uint)local_d8;
          if ((uVar12 == 0) || (uVar13 = (uint)uVar27, uVar13 == 0)) {
LAB_001eaafa:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          bVar4 = true;
          if (3 < uVar10) {
            iVar8 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            uVar12 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            if ((int)((uVar12 ^ 0x1f) + (int)uVar26 * 4 + -0x1b) < (int)uVar10 * 4 - iVar8) {
              bVar4 = false;
              uVar26 = uVar10;
              uVar27 = local_d8;
              local_e0 = piVar22;
            }
          }
          lVar19 = lVar19 + 1;
          uVar7 = uVar7 - 1;
        } while (!bVar4);
        piVar22 = local_c0;
        uVar12 = uVar20;
        if (3 < uVar27) {
          pcVar17 = (char *)((long)local_e0 + (3 - (long)(local_a8 + uVar27)));
          pBVar11 = local_98;
          pBVar14 = local_a8;
          if ((uint)pcVar17 < (uint)local_c8) {
            pBVar11 = local_68;
            pBVar14 = local_b0;
          }
          if ((local_e8 < local_e0) &&
             (uVar10 = (ulong)pcVar17 & 0xffffffff, pBVar11 < pBVar14 + uVar10)) {
            pBVar14 = pBVar14 + uVar10;
            do {
              piVar18 = (int *)((long)local_e0 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar18 != *pBVar14) ||
                 (uVar26 = uVar26 + 1, local_e0 = piVar18, piVar18 <= local_e8)) break;
            } while (pBVar11 < pBVar14);
          }
          uVar12 = (U32)uVar27 - 3;
          local_ec = uVar20;
        }
        uVar20 = uVar12;
        if (local_b8->maxNbSeq <=
            (ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart >> 3)) {
LAB_001eab19:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_b8->maxNbLit) {
LAB_001eab38:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar10 = (long)local_e0 - (long)local_e8;
        pBVar14 = local_b8->lit;
        if (local_b8->litStart + local_b8->maxNbLit < pBVar14 + uVar10) {
LAB_001eab76:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c0 < local_e0) {
LAB_001eab57:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_80 < local_e0) {
          ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_e8,(BYTE *)local_e0,(BYTE *)local_80);
        }
        else {
          uVar5 = *(undefined8 *)(local_e8 + 2);
          *(undefined8 *)pBVar14 = *(undefined8 *)local_e8;
          *(undefined8 *)(pBVar14 + 8) = uVar5;
          if (0x10 < uVar10) {
            pBVar14 = local_b8->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar14 + 0x10 + (-0x10 - (long)(local_e8 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)(local_e8 + 6);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_e8 + 4);
            *(undefined8 *)(pBVar14 + 0x18) = uVar5;
            if (0x20 < (long)uVar10) {
              lVar19 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_e8 + lVar19 + 0x20);
                uVar5 = puVar1[1];
                pBVar11 = pBVar14 + lVar19 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)local_e8 + lVar19 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar5;
                lVar19 = lVar19 + 0x20;
              } while (pBVar11 + 0x20 < pBVar14 + uVar10);
            }
          }
        }
        piVar18 = local_78;
        psVar6 = local_b8;
        local_b8->lit = local_b8->lit + uVar10;
        if (0xffff < uVar10) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_literalLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)local_b8->sequences - (long)local_b8->sequencesStart) >> 3);
        }
        psVar3 = local_b8->sequences;
        psVar3->litLength = (U16)uVar10;
        psVar3->offBase = (U32)uVar27;
        if (uVar26 < 3) {
LAB_001eab95:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar26 - 3) {
          if (local_b8->longLengthType != ZSTD_llt_none) {
LAB_001eabb4:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b8->longLengthType = ZSTD_llt_matchLength;
          local_b8->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_b8->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(uVar26 - 3);
        local_b8->sequences = psVar3 + 1;
        if (local_d0->lazySkipping != 0) {
          local_d0->lazySkipping = 0;
        }
        ip = (int *)((long)local_e0 + uVar26);
        ms = local_d0;
        pBVar14 = local_a8;
        pBVar11 = local_b0;
        uVar10 = local_c8;
        local_e8 = ip;
        do {
          if (piVar18 < ip) break;
          iVar8 = (int)ip - (int)pBVar14;
          UVar2 = (ms->window).lowLimit;
          UVar16 = iVar8 - (uint)local_88;
          if (iVar8 - UVar2 <= (uint)local_88) {
            UVar16 = UVar2;
          }
          if (ms->loadedDictEnd != 0) {
            UVar16 = UVar2;
          }
          uVar12 = iVar8 - local_ec;
          pBVar24 = pBVar14;
          if (uVar12 < (uint)uVar10) {
            pBVar24 = pBVar11;
          }
          if (((local_a0 - uVar12 < 3) || (iVar8 - UVar16 < local_ec)) ||
             (*ip != *(int *)(pBVar24 + uVar12))) {
            bVar4 = false;
            uVar12 = local_ec;
          }
          else {
            piVar15 = piVar22;
            if (uVar12 < (uint)uVar10) {
              piVar15 = local_90;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar24 + uVar12) + 4),
                               (BYTE *)piVar22,(BYTE *)piVar15,local_98);
            if (psVar6->maxNbSeq <=
                (ulong)((long)psVar6->sequences - (long)psVar6->sequencesStart >> 3))
            goto LAB_001eab19;
            if (0x20000 < psVar6->maxNbLit) goto LAB_001eab38;
            pBVar14 = psVar6->lit;
            if (psVar6->litStart + psVar6->maxNbLit < pBVar14) goto LAB_001eab76;
            if (piVar22 < local_e8) goto LAB_001eab57;
            if (local_80 < local_e8) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_e8,(BYTE *)local_e8,(BYTE *)local_80);
            }
            else {
              uVar5 = *(undefined8 *)(local_e8 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)local_e8;
              *(undefined8 *)(pBVar14 + 8) = uVar5;
            }
            psVar3 = psVar6->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_001eab95;
            if (0xffff < sVar9 + 1) {
              if (psVar6->longLengthType != ZSTD_llt_none) goto LAB_001eabb4;
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(sVar9 + 1);
            psVar6->sequences = psVar3 + 1;
            ip = (int *)((long)ip + sVar9 + 4);
            bVar4 = true;
            ms = local_d0;
            pBVar14 = local_a8;
            pBVar11 = local_b0;
            uVar10 = local_c8;
            uVar12 = uVar20;
            local_e8 = ip;
            uVar20 = local_ec;
          }
          local_ec = uVar12;
        } while (bVar4);
      }
    } while (ip < piVar18);
  }
  *local_70 = uVar20;
  local_70[1] = local_ec;
  return (long)piVar22 - (long)local_e8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}